

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O1

WJTL_STATUS VerifyOutputSigned(int64_t Number,char *StringMatch)

{
  JL_STATUS JVar1;
  JL_STATUS JVar2;
  JL_STATUS JVar3;
  int iVar4;
  JL_STATUS JVar5;
  WJTL_STATUS WVar6;
  char *jsonString;
  JlDataObject *numberObject;
  char *local_40;
  JlDataObject *local_38;
  
  local_38 = (JlDataObject *)0x0;
  local_40 = (char *)0x0;
  JVar1 = JlCreateObject(JL_DATA_TYPE_NUMBER,&local_38);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlCreateObject( JL_DATA_TYPE_NUMBER, &numberObject ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x40);
  JVar2 = JlSetObjectNumberS64(local_38,Number);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlSetObjectNumberS64( numberObject, Number ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x41);
  JVar3 = JlOutputJson(local_38,false,&local_40);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlOutputJson( numberObject, 0, &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x42);
  iVar4 = strcmp(local_40,StringMatch);
  WjTestLib_Assert(iVar4 == 0,"strcmp( jsonString, StringMatch ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x43);
  JVar5 = JlFreeObjectTree(&local_38);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &numberObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x44);
  WVar6 = WJTL_STATUS_FAILED;
  if (((JVar3 == JL_STATUS_SUCCESS && iVar4 == 0) &&
      (JVar2 == JL_STATUS_SUCCESS && JVar1 == JL_STATUS_SUCCESS)) && JVar5 == JL_STATUS_SUCCESS) {
    WVar6 = WJTL_STATUS_SUCCESS;
  }
  WjTestLib_Free(local_40);
  return WVar6;
}

Assistant:

static
WJTL_STATUS
    VerifyOutputSigned
    (
        int64_t     Number,
        char const* StringMatch
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    JlDataObject* numberObject = NULL;
    char* jsonString = NULL;

    JL_ASSERT_SUCCESS( JlCreateObject( JL_DATA_TYPE_NUMBER, &numberObject ) );
    JL_ASSERT_SUCCESS( JlSetObjectNumberS64( numberObject, Number ) );
    JL_ASSERT_SUCCESS( JlOutputJson( numberObject, false, &jsonString ) );
    JL_ASSERT( strcmp( jsonString, StringMatch ) == 0 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &numberObject ) );
    JlFree( jsonString );
    jsonString = NULL;

    return TestReturn;
}